

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mark.cpp
# Opt level: O0

Read<signed_char> __thiscall
Omega_h::mark_down(Omega_h *this,Mesh *mesh,Int high_dim,Int low_dim,Read<signed_char> *high_marked)

{
  bool bVar1;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar2;
  Read<signed_char> RVar3;
  Read<signed_char> local_e0;
  undefined1 local_d0 [48];
  Read<signed_char> local_a0 [2];
  Graph local_80;
  undefined1 local_59;
  undefined1 local_58 [8];
  Adj l2h;
  Read<signed_char> *high_marked_local;
  Int low_dim_local;
  Int high_dim_local;
  Mesh *mesh_local;
  Read<signed_char> *low_marks;
  
  l2h.codes.write_.shared_alloc_.direct_ptr = high_marked;
  if (low_dim < 0) {
    fail("assertion %s failed at %s +%d\n","0 <= low_dim",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mark.cpp"
         ,0x24);
  }
  if (high_dim < low_dim) {
    fail("assertion %s failed at %s +%d\n","low_dim <= high_dim",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mark.cpp"
         ,0x25);
  }
  if (3 < high_dim) {
    fail("assertion %s failed at %s +%d\n","high_dim <= 3",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mark.cpp"
         ,0x26);
  }
  if (high_dim == low_dim) {
    Read<signed_char>::Read((Read<signed_char> *)this,high_marked);
    pvVar2 = extraout_RDX;
  }
  else {
    Mesh::ask_up((Adj *)local_58,mesh,low_dim,high_dim);
    local_59 = 0;
    Graph::Graph(&local_80,(Graph *)local_58);
    Read<signed_char>::Read(local_a0,high_marked);
    mark_down(this,&local_80,local_a0);
    Read<signed_char>::~Read(local_a0);
    Graph::~Graph(&local_80);
    bVar1 = Mesh::owners_have_all_upward(mesh,low_dim);
    if (!bVar1) {
      Read<signed_char>::Read((Read<signed_char> *)(local_d0 + 0x10),(Read<signed_char> *)this);
      Mesh::reduce_array<signed_char>
                ((Mesh *)(local_d0 + 0x20),(Int)mesh,(Read<signed_char> *)(ulong)(uint)low_dim,
                 (int)local_d0 + 0x10,OMEGA_H_MAX);
      Read<signed_char>::operator=((Read<signed_char> *)this,(Read<signed_char> *)(local_d0 + 0x20))
      ;
      Read<signed_char>::~Read((Read<signed_char> *)(local_d0 + 0x20));
      Read<signed_char>::~Read((Read<signed_char> *)(local_d0 + 0x10));
    }
    Read<signed_char>::Read(&local_e0,(Read<signed_char> *)this);
    Mesh::sync_array<signed_char>
              ((Mesh *)local_d0,(Int)mesh,(Read<signed_char> *)(ulong)(uint)low_dim,(Int)&local_e0);
    Read<signed_char>::operator=((Read<signed_char> *)this,(Read<signed_char> *)local_d0);
    Read<signed_char>::~Read((Read<signed_char> *)local_d0);
    Read<signed_char>::~Read(&local_e0);
    local_59 = 1;
    Adj::~Adj((Adj *)local_58);
    pvVar2 = extraout_RDX_00;
  }
  RVar3.write_.shared_alloc_.direct_ptr = pvVar2;
  RVar3.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar3.write_.shared_alloc_;
}

Assistant:

Read<I8> mark_down(
    Mesh* mesh, Int high_dim, Int low_dim, Read<I8> high_marked) {
  OMEGA_H_CHECK(0 <= low_dim);
  OMEGA_H_CHECK(low_dim <= high_dim);
  OMEGA_H_CHECK(high_dim <= 3);
  if (high_dim == low_dim) return high_marked;
  auto l2h = mesh->ask_up(low_dim, high_dim);
  auto low_marks = mark_down(l2h, high_marked);
  if (!mesh->owners_have_all_upward(low_dim)) {
    low_marks = mesh->reduce_array(low_dim, low_marks, 1, OMEGA_H_MAX);
  }
  low_marks = mesh->sync_array(low_dim, low_marks, 1);
  return low_marks;
}